

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DirectorySnapshot.cpp
# Opt level: O0

DirectorySnapshotDiff * __thiscall
efsw::DirectorySnapshot::scan(DirectorySnapshotDiff *__return_storage_ptr__,DirectorySnapshot *this)

{
  bool bVar1;
  reference ppVar2;
  mapped_type *pmVar3;
  pointer ppVar4;
  _Self local_2a0;
  _Base_ptr local_298;
  _Base_ptr local_290;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_efsw::FileInfo>
  local_288;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_efsw::FileInfo>
  local_220;
  _Self local_1b8;
  _Base_ptr local_1b0;
  allocator local_1a1;
  string local_1a0 [8];
  string oldFile;
  _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_efsw::FileInfo>_>
  local_180;
  iterator fit;
  _Self local_168;
  _Base_ptr local_160;
  _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_efsw::FileInfo>_>
  local_158;
  iterator fiIt;
  iterator it;
  FileInfoMap FilesCpy;
  FileInfo fi;
  undefined1 local_b0 [8];
  FileInfoMap files;
  undefined1 local_78 [8];
  FileInfo curFI;
  DirectorySnapshot *this_local;
  DirectorySnapshotDiff *Diff;
  
  DirectorySnapshotDiff::DirectorySnapshotDiff(__return_storage_ptr__);
  DirectorySnapshotDiff::clear(__return_storage_ptr__);
  FileInfo::FileInfo((FileInfo *)local_78,(string *)this);
  bVar1 = FileInfo::operator!=(&this->DirectoryInfo,(FileInfo *)local_78);
  __return_storage_ptr__->DirChanged = bVar1;
  if ((__return_storage_ptr__->DirChanged & 1U) != 0) {
    FileInfo::operator=(&this->DirectoryInfo,(FileInfo *)local_78);
  }
  bVar1 = FileInfo::exists((FileInfo *)local_78);
  if (bVar1) {
    std::__cxx11::string::string((string *)&fi.Inode,(string *)this);
    FileSystem::filesInfoFromPath((FileInfoMap *)local_b0,(string *)&fi.Inode);
    std::__cxx11::string::~string((string *)&fi.Inode);
    bVar1 = std::
            map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_efsw::FileInfo,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_efsw::FileInfo>_>_>
            ::empty((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_efsw::FileInfo,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_efsw::FileInfo>_>_>
                     *)local_b0);
    if ((bVar1) &&
       (bVar1 = std::
                map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_efsw::FileInfo,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_efsw::FileInfo>_>_>
                ::empty(&this->Files), bVar1)) {
      files._M_t._M_impl.super__Rb_tree_header._M_node_count._4_4_ = 1;
    }
    else {
      FileInfo::FileInfo((FileInfo *)&FilesCpy._M_t._M_impl.super__Rb_tree_header._M_node_count);
      std::
      map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_efsw::FileInfo,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_efsw::FileInfo>_>_>
      ::map((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_efsw::FileInfo,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_efsw::FileInfo>_>_>
             *)&it);
      std::
      _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_efsw::FileInfo>_>
      ::_Rb_tree_iterator(&fiIt);
      std::
      _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_efsw::FileInfo>_>
      ::_Rb_tree_iterator(&local_158);
      if ((__return_storage_ptr__->DirChanged & 1U) != 0) {
        std::
        map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_efsw::FileInfo,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_efsw::FileInfo>_>_>
        ::operator=((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_efsw::FileInfo,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_efsw::FileInfo>_>_>
                     *)&it,&this->Files);
      }
      local_160 = (_Base_ptr)
                  std::
                  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_efsw::FileInfo,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_efsw::FileInfo>_>_>
                  ::begin((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_efsw::FileInfo,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_efsw::FileInfo>_>_>
                           *)local_b0);
      fiIt = (iterator)local_160;
      while( true ) {
        local_168._M_node =
             (_Base_ptr)
             std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_efsw::FileInfo,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_efsw::FileInfo>_>_>
             ::end((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_efsw::FileInfo,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_efsw::FileInfo>_>_>
                    *)local_b0);
        bVar1 = std::operator!=(&fiIt,&local_168);
        if (!bVar1) break;
        ppVar4 = std::
                 _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_efsw::FileInfo>_>
                 ::operator->(&fiIt);
        FileInfo::operator=((FileInfo *)&FilesCpy._M_t._M_impl.super__Rb_tree_header._M_node_count,
                            &ppVar4->second);
        ppVar4 = std::
                 _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_efsw::FileInfo>_>
                 ::operator->(&fiIt);
        local_158._M_node =
             (_Base_ptr)
             std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_efsw::FileInfo,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_efsw::FileInfo>_>_>
             ::find(&this->Files,&ppVar4->first);
        fit = std::
              map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_efsw::FileInfo,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_efsw::FileInfo>_>_>
              ::end(&this->Files);
        bVar1 = std::operator!=(&local_158,&fit);
        if (bVar1) {
          ppVar4 = std::
                   _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_efsw::FileInfo>_>
                   ::operator->(&fiIt);
          std::
          map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_efsw::FileInfo,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_efsw::FileInfo>_>_>
          ::erase((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_efsw::FileInfo,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_efsw::FileInfo>_>_>
                   *)&it,&ppVar4->first);
          ppVar2 = std::
                   _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_efsw::FileInfo>_>
                   ::operator*(&local_158);
          bVar1 = FileInfo::operator!=
                            (&ppVar2->second,
                             (FileInfo *)&FilesCpy._M_t._M_impl.super__Rb_tree_header._M_node_count)
          ;
          if (bVar1) {
            ppVar4 = std::
                     _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_efsw::FileInfo>_>
                     ::operator->(&fiIt);
            pmVar3 = std::
                     map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_efsw::FileInfo,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_efsw::FileInfo>_>_>
                     ::operator[](&this->Files,&ppVar4->first);
            FileInfo::operator=(pmVar3,(FileInfo *)
                                       &FilesCpy._M_t._M_impl.super__Rb_tree_header._M_node_count);
            bVar1 = FileInfo::isDirectory
                              ((FileInfo *)
                               &FilesCpy._M_t._M_impl.super__Rb_tree_header._M_node_count);
            if (bVar1) {
              std::vector<efsw::FileInfo,_std::allocator<efsw::FileInfo>_>::push_back
                        (&__return_storage_ptr__->DirsModified,
                         (value_type *)&FilesCpy._M_t._M_impl.super__Rb_tree_header._M_node_count);
            }
            else {
              std::vector<efsw::FileInfo,_std::allocator<efsw::FileInfo>_>::push_back
                        (&__return_storage_ptr__->FilesModified,
                         (value_type *)&FilesCpy._M_t._M_impl.super__Rb_tree_header._M_node_count);
            }
          }
        }
        else {
          bVar1 = FileInfo::isRegularFile
                            ((FileInfo *)&FilesCpy._M_t._M_impl.super__Rb_tree_header._M_node_count)
          ;
          if ((bVar1) ||
             (bVar1 = FileInfo::isDirectory
                                ((FileInfo *)
                                 &FilesCpy._M_t._M_impl.super__Rb_tree_header._M_node_count), bVar1)
             ) {
            ppVar4 = std::
                     _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_efsw::FileInfo>_>
                     ::operator->(&fiIt);
            pmVar3 = std::
                     map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_efsw::FileInfo,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_efsw::FileInfo>_>_>
                     ::operator[](&this->Files,&ppVar4->first);
            FileInfo::operator=(pmVar3,(FileInfo *)
                                       &FilesCpy._M_t._M_impl.super__Rb_tree_header._M_node_count);
            std::
            _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_efsw::FileInfo>_>
            ::_Rb_tree_iterator(&local_180);
            std::allocator<char>::allocator();
            std::__cxx11::string::string(local_1a0,"",&local_1a1);
            std::allocator<char>::~allocator((allocator<char> *)&local_1a1);
            local_1b0 = (_Base_ptr)
                        nodeInFiles_abi_cxx11_
                                  (this,(FileInfo *)
                                        &FilesCpy._M_t._M_impl.super__Rb_tree_header._M_node_count);
            local_180._M_node = local_1b0;
            local_1b8._M_node =
                 (_Base_ptr)
                 std::
                 map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_efsw::FileInfo,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_efsw::FileInfo>_>_>
                 ::end(&this->Files);
            bVar1 = std::operator!=(&local_180,&local_1b8);
            if (bVar1) {
              ppVar4 = std::
                       _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_efsw::FileInfo>_>
                       ::operator->(&local_180);
              std::__cxx11::string::operator=(local_1a0,(string *)ppVar4);
              ppVar4 = std::
                       _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_efsw::FileInfo>_>
                       ::operator->(&local_180);
              std::
              map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_efsw::FileInfo,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_efsw::FileInfo>_>_>
              ::erase((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_efsw::FileInfo,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_efsw::FileInfo>_>_>
                       *)&it,&ppVar4->first);
              ppVar4 = std::
                       _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_efsw::FileInfo>_>
                       ::operator->(&local_180);
              std::
              map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_efsw::FileInfo,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_efsw::FileInfo>_>_>
              ::erase(&this->Files,&ppVar4->first);
              bVar1 = FileInfo::isDirectory
                                ((FileInfo *)
                                 &FilesCpy._M_t._M_impl.super__Rb_tree_header._M_node_count);
              if (bVar1) {
                std::make_pair<std::__cxx11::string&,efsw::FileInfo&>
                          (&local_220,
                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           local_1a0,
                           (FileInfo *)&FilesCpy._M_t._M_impl.super__Rb_tree_header._M_node_count);
                std::
                vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_efsw::FileInfo>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_efsw::FileInfo>_>_>
                ::push_back(&__return_storage_ptr__->DirsMoved,&local_220);
                std::
                pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_efsw::FileInfo>
                ::~pair(&local_220);
              }
              else {
                std::make_pair<std::__cxx11::string&,efsw::FileInfo&>
                          (&local_288,
                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           local_1a0,
                           (FileInfo *)&FilesCpy._M_t._M_impl.super__Rb_tree_header._M_node_count);
                std::
                vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_efsw::FileInfo>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_efsw::FileInfo>_>_>
                ::push_back(&__return_storage_ptr__->FilesMoved,&local_288);
                std::
                pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_efsw::FileInfo>
                ::~pair(&local_288);
              }
            }
            else {
              bVar1 = FileInfo::isDirectory
                                ((FileInfo *)
                                 &FilesCpy._M_t._M_impl.super__Rb_tree_header._M_node_count);
              if (bVar1) {
                std::vector<efsw::FileInfo,_std::allocator<efsw::FileInfo>_>::push_back
                          (&__return_storage_ptr__->DirsCreated,
                           (value_type *)&FilesCpy._M_t._M_impl.super__Rb_tree_header._M_node_count)
                ;
              }
              else {
                std::vector<efsw::FileInfo,_std::allocator<efsw::FileInfo>_>::push_back
                          (&__return_storage_ptr__->FilesCreated,
                           (value_type *)&FilesCpy._M_t._M_impl.super__Rb_tree_header._M_node_count)
                ;
              }
            }
            std::__cxx11::string::~string(local_1a0);
          }
        }
        local_290 = (_Base_ptr)
                    std::
                    _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_efsw::FileInfo>_>
                    ::operator++(&fiIt,0);
      }
      if ((__return_storage_ptr__->DirChanged & 1U) != 0) {
        local_298 = (_Base_ptr)
                    std::
                    map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_efsw::FileInfo,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_efsw::FileInfo>_>_>
                    ::begin((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_efsw::FileInfo,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_efsw::FileInfo>_>_>
                             *)&it);
        fiIt = (iterator)local_298;
        while( true ) {
          local_2a0._M_node =
               (_Base_ptr)
               std::
               map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_efsw::FileInfo,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_efsw::FileInfo>_>_>
               ::end((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_efsw::FileInfo,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_efsw::FileInfo>_>_>
                      *)&it);
          bVar1 = std::operator!=(&fiIt,&local_2a0);
          if (!bVar1) break;
          ppVar4 = std::
                   _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_efsw::FileInfo>_>
                   ::operator->(&fiIt);
          FileInfo::operator=((FileInfo *)&FilesCpy._M_t._M_impl.super__Rb_tree_header._M_node_count
                              ,&ppVar4->second);
          bVar1 = FileInfo::isDirectory
                            ((FileInfo *)&FilesCpy._M_t._M_impl.super__Rb_tree_header._M_node_count)
          ;
          if (bVar1) {
            std::vector<efsw::FileInfo,_std::allocator<efsw::FileInfo>_>::push_back
                      (&__return_storage_ptr__->DirsDeleted,
                       (value_type *)&FilesCpy._M_t._M_impl.super__Rb_tree_header._M_node_count);
          }
          else {
            std::vector<efsw::FileInfo,_std::allocator<efsw::FileInfo>_>::push_back
                      (&__return_storage_ptr__->FilesDeleted,
                       (value_type *)&FilesCpy._M_t._M_impl.super__Rb_tree_header._M_node_count);
          }
          ppVar4 = std::
                   _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_efsw::FileInfo>_>
                   ::operator->(&fiIt);
          std::
          map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_efsw::FileInfo,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_efsw::FileInfo>_>_>
          ::erase(&this->Files,&ppVar4->first);
          std::
          _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_efsw::FileInfo>_>
          ::operator++(&fiIt,0);
        }
      }
      files._M_t._M_impl.super__Rb_tree_header._M_node_count._4_4_ = 1;
      std::
      map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_efsw::FileInfo,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_efsw::FileInfo>_>_>
      ::~map((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_efsw::FileInfo,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_efsw::FileInfo>_>_>
              *)&it);
      FileInfo::~FileInfo((FileInfo *)&FilesCpy._M_t._M_impl.super__Rb_tree_header._M_node_count);
    }
    std::
    map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_efsw::FileInfo,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_efsw::FileInfo>_>_>
    ::~map((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_efsw::FileInfo,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_efsw::FileInfo>_>_>
            *)local_b0);
  }
  else {
    deleteAll(this,__return_storage_ptr__);
    files._M_t._M_impl.super__Rb_tree_header._M_node_count._4_4_ = 1;
  }
  FileInfo::~FileInfo((FileInfo *)local_78);
  return __return_storage_ptr__;
}

Assistant:

DirectorySnapshotDiff DirectorySnapshot::scan() {
	DirectorySnapshotDiff Diff;

	Diff.clear();

	FileInfo curFI( DirectoryInfo.Filepath );

	Diff.DirChanged = DirectoryInfo != curFI;

	if ( Diff.DirChanged ) {
		DirectoryInfo = curFI;
	}

	/// If the directory was erased, create the events for files and directories deletion
	if ( !curFI.exists() ) {
		deleteAll( Diff );

		return Diff;
	}

	FileInfoMap files = FileSystem::filesInfoFromPath( DirectoryInfo.Filepath );

	if ( files.empty() && Files.empty() ) {
		return Diff;
	}

	FileInfo fi;
	FileInfoMap FilesCpy;
	FileInfoMap::iterator it;
	FileInfoMap::iterator fiIt;

	if ( Diff.DirChanged ) {
		FilesCpy = Files;
	}

	for ( it = files.begin(); it != files.end(); it++ ) {
		fi = it->second;

		/// File existed before?
		fiIt = Files.find( it->first );

		if ( fiIt != Files.end() ) {
			/// Erase from the file list copy
			FilesCpy.erase( it->first );

			/// File changed?
			if ( ( *fiIt ).second != fi ) {
				/// Update the new file info
				Files[it->first] = fi;

				/// handle modified event
				if ( fi.isDirectory() ) {
					Diff.DirsModified.push_back( fi );
				} else {
					Diff.FilesModified.push_back( fi );
				}
			}
		}
		/// Only add regular files or directories
		else if ( fi.isRegularFile() || fi.isDirectory() ) {
			/// New file found
			Files[it->first] = fi;

			FileInfoMap::iterator fit;
			std::string oldFile = "";

			/// Check if the same inode already existed
			if ( ( fit = nodeInFiles( fi ) ) != Files.end() ) {
				oldFile = fit->first;

				/// Avoid firing a Delete event
				FilesCpy.erase( fit->first );

				/// Delete the old file name
				Files.erase( fit->first );

				if ( fi.isDirectory() ) {
					Diff.DirsMoved.push_back( std::make_pair( oldFile, fi ) );
				} else {
					Diff.FilesMoved.push_back( std::make_pair( oldFile, fi ) );
				}
			} else {
				if ( fi.isDirectory() ) {
					Diff.DirsCreated.push_back( fi );
				} else {
					Diff.FilesCreated.push_back( fi );
				}
			}
		}
	}

	if ( !Diff.DirChanged ) {
		return Diff;
	}

	/// The files or directories that remains were deleted
	for ( it = FilesCpy.begin(); it != FilesCpy.end(); it++ ) {
		fi = it->second;

		if ( fi.isDirectory() ) {
			Diff.DirsDeleted.push_back( fi );
		} else {
			Diff.FilesDeleted.push_back( fi );
		}

		/// Remove the file or directory from the list of files
		Files.erase( it->first );
	}

	return Diff;
}